

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv2022.cpp
# Opt level: O1

void UConverter_toUnicode_ISO_2022_CN_OFFSETS_LOGIC(UConverterToUnicodeArgs *args,UErrorCode *err)

{
  char cVar1;
  byte bVar2;
  UConverter *pUVar3;
  byte *sourceLimit;
  void *pvVar4;
  UChar *pUVar5;
  int32_t *piVar6;
  UChar UVar7;
  uint uVar8;
  byte *pbVar9;
  byte *pbVar10;
  int8_t iVar11;
  int32_t length;
  int iVar12;
  uint uVar13;
  long lVar14;
  UConverterSharedData *sharedData;
  UChar *pUVar15;
  UChar *pUVar16;
  byte *local_50;
  byte local_43;
  byte local_42;
  byte local_41;
  byte *local_40;
  undefined4 *local_38;
  
  local_50 = (byte *)args->source;
  pUVar15 = args->target;
  pUVar3 = args->converter;
  sourceLimit = (byte *)args->sourceLimit;
  pvVar4 = pUVar3->extraInfo;
  local_38 = (undefined4 *)((long)pvVar4 + 0x5c);
  if (*(int *)((long)pvVar4 + 0x68) == 0) {
    if (sourceLimit <= local_50 || pUVar3->toULength != '\x01') goto LAB_0030e534;
    if (args->targetLimit <= pUVar15) goto LAB_0030e534;
    uVar13 = (uint)pUVar3->toUBytes[0];
    pUVar3->toULength = '\0';
    goto LAB_0030e625;
  }
LAB_0030e46e:
  local_40 = local_50;
  cVar1 = args->converter->toULength;
  changeState_2022(args->converter,(char **)&local_50,(char *)sourceLimit,ISO_2022_CN,err);
  if (((*(int *)((long)pvVar4 + 0x68) == 0) && (*err < U_ILLEGAL_ARGUMENT_ERROR)) &&
     (*(char *)((long)pvVar4 + 0x70) != '\0')) {
    *err = U_ILLEGAL_ESCAPE_SEQUENCE;
    pUVar3 = args->converter;
    pUVar3->toUCallbackReason = UCNV_IRREGULAR;
    pUVar3->toULength = cVar1 + ((char)local_50 - (char)local_40);
  }
  if (*err < U_ILLEGAL_ARGUMENT_ERROR) {
LAB_0030e534:
    while (pbVar10 = local_50, local_50 < sourceLimit) {
      pUVar5 = args->targetLimit;
      pbVar9 = local_50;
LAB_0030e54f:
      if (pUVar5 <= pUVar15) {
        *err = U_BUFFER_OVERFLOW_ERROR;
        pbVar10 = local_50;
        break;
      }
      bVar2 = *pbVar9;
      uVar13 = (uint)bVar2;
      pUVar16 = pUVar15;
      switch(bVar2) {
      case 10:
      case 0xd:
        *(undefined2 *)(local_38 + 1) = 0;
        *local_38 = 0;
        break;
      case 0xe:
        if (*(char *)((long)pvVar4 + 0x5d) != '\0') {
          *(undefined1 *)((long)pvVar4 + 0x60) = 1;
          *(undefined1 *)((long)pvVar4 + 0x70) = 1;
          goto LAB_0030e596;
        }
        local_50 = pbVar9 + 1;
        *(undefined1 *)((long)pvVar4 + 0x70) = 0;
        uVar13 = 0xe;
        uVar8 = 0xffff;
        goto LAB_0030e6f5;
      case 0xf:
        *(undefined1 *)((long)pvVar4 + 0x60) = 0;
        if (*(char *)((long)pvVar4 + 0x70) == '\0') goto LAB_0030e596;
        local_50 = pbVar9 + 1;
        *(undefined1 *)((long)pvVar4 + 0x70) = 0;
        *err = U_ILLEGAL_ESCAPE_SEQUENCE;
        pUVar3 = args->converter;
        pUVar3->toUCallbackReason = UCNV_IRREGULAR;
        pUVar3->toUBytes[0] = bVar2;
        args->converter->toULength = '\x01';
        args->target = pUVar15;
        goto LAB_0030e5bd;
      default:
        local_50 = pbVar9;
        if (uVar13 == 0x1b) goto LAB_0030e46e;
      case 0xb:
      case 0xc:
      }
      local_50 = pbVar9 + 1;
      *(undefined1 *)((long)pvVar4 + 0x70) = 0;
      if (*(char *)((long)pvVar4 + 0x60) == '\0') {
        uVar8 = 0xffff;
        if (-1 < (char)bVar2) {
          uVar8 = uVar13;
        }
      }
      else {
        if (sourceLimit <= pbVar9 + 1) {
          args->converter->toUBytes[0] = bVar2;
          args->converter->toULength = '\x01';
          pbVar10 = local_50;
          break;
        }
LAB_0030e625:
        bVar2 = *local_50;
        local_40 = (byte *)(ulong)bVar2;
        if ((byte)(bVar2 - 0x21) < 0x5e && (uVar13 + 0xdf & 0xfe) < 0x5e) {
          local_50 = local_50 + 1;
          cVar1 = *(char *)((long)pvVar4 + (long)*(char *)((long)pvVar4 + 0x60) + 0x5c);
          if ((long)cVar1 < 0x20) {
            pbVar10 = &local_42;
            sharedData = *(UConverterSharedData **)((long)pvVar4 + (long)cVar1 * 8);
            length = 2;
            local_43 = (byte)uVar13;
          }
          else {
            sharedData = *(UConverterSharedData **)((long)pvVar4 + 0x18);
            pbVar10 = &local_41;
            length = 3;
            local_43 = cVar1 + 0x60;
            local_42 = (byte)uVar13;
          }
          *pbVar10 = bVar2;
          uVar8 = ucnv_MBCSSimpleGetNextUChar_63(sharedData,(char *)&local_43,length,'\0');
          uVar13 = uVar13 * 0x100 + (int)local_40;
        }
        else {
          uVar8 = 0xffff;
          if ((0x5d < (byte)(bVar2 - 0x21)) &&
             ((0x1f < bVar2 || ((0x800c000U >> (bVar2 & 0x1f) & 1) == 0)))) {
            local_50 = local_50 + 1;
            uVar13 = uVar13 * 0x100 + (uint)bVar2 + 0x10000;
          }
        }
        pUVar16 = pUVar15;
        if ('\x01' < *(char *)((long)pvVar4 + 0x60)) {
          *(undefined1 *)((long)pvVar4 + 0x60) = *(undefined1 *)((long)pvVar4 + 0x61);
        }
      }
LAB_0030e6f5:
      if (uVar8 < 0xfffe) {
        if (args->offsets != (int32_t *)0x0) {
          iVar12 = -1;
          if (0xff < uVar13) {
            iVar12 = -2;
          }
          *(int *)((long)args->offsets + ((long)pUVar16 - (long)args->target) * 2) =
               (iVar12 + (int)local_50) - *(int *)&args->source;
        }
        *pUVar16 = (UChar)uVar8;
        pUVar15 = pUVar16 + 1;
      }
      else {
        if (uVar8 < 0x10000) {
          pUVar3 = args->converter;
          if (uVar13 < 0x100) {
            iVar11 = '\x01';
            lVar14 = 0x41;
          }
          else {
            pUVar3->toUBytes[0] = (uint8_t)(uVar13 >> 8);
            iVar11 = '\x02';
            lVar14 = 0x42;
          }
          pUVar3->toUBytes[lVar14 + -0x41] = (uint8_t)uVar13;
          pUVar3->toULength = iVar11;
          *err = (uint)(uVar8 != 0xfffe) * 2 + U_INVALID_CHAR_FOUND;
          pUVar15 = pUVar16;
          pbVar10 = local_50;
          break;
        }
        *pUVar16 = (short)(uVar8 + 0x3ff0000 >> 10) + L'\xd800';
        piVar6 = args->offsets;
        if (piVar6 != (int32_t *)0x0) {
          iVar12 = -1;
          if (0xff < uVar13) {
            iVar12 = -2;
          }
          *(int *)((long)piVar6 + ((long)pUVar16 - (long)args->target) * 2) =
               (iVar12 + (int)local_50) - *(int *)&args->source;
        }
        pUVar15 = pUVar16 + 1;
        UVar7 = (UChar)uVar8 & 0x3ffU | 0xdc00;
        if (pUVar15 < args->targetLimit) {
          *pUVar15 = UVar7;
          if (piVar6 != (int32_t *)0x0) {
            iVar12 = -1;
            if (0xff < uVar13) {
              iVar12 = -2;
            }
            *(int *)((long)piVar6 + ((long)pUVar15 - (long)args->target) * 2) =
                 (iVar12 + (int)local_50) - *(int *)&args->source;
          }
          pUVar15 = pUVar16 + 2;
        }
        else {
          pUVar3 = args->converter;
          cVar1 = pUVar3->UCharErrorBufferLength;
          pUVar3->UCharErrorBufferLength = cVar1 + '\x01';
          pUVar3->UCharErrorBuffer[cVar1] = UVar7;
        }
      }
    }
LAB_0030e5b4:
    local_50 = pbVar10;
    args->target = pUVar15;
LAB_0030e5bd:
    args->source = (char *)local_50;
  }
  else {
    args->target = pUVar15;
    args->source = (char *)local_50;
    *(undefined1 *)((long)pvVar4 + 0x70) = 0;
  }
  return;
LAB_0030e596:
  pbVar9 = pbVar9 + 1;
  pbVar10 = sourceLimit;
  if (pbVar9 == sourceLimit) goto LAB_0030e5b4;
  goto LAB_0030e54f;
}

Assistant:

static void U_CALLCONV
UConverter_toUnicode_ISO_2022_CN_OFFSETS_LOGIC(UConverterToUnicodeArgs *args,
                                               UErrorCode* err){
    char tempBuf[3];
    const char *mySource = (char *) args->source;
    UChar *myTarget = args->target;
    const char *mySourceLimit = args->sourceLimit;
    uint32_t targetUniChar = 0x0000;
    uint32_t mySourceChar = 0x0000;
    UConverterDataISO2022* myData;
    ISO2022State *pToU2022State;

    myData=(UConverterDataISO2022*)(args->converter->extraInfo);
    pToU2022State = &myData->toU2022State;

    if(myData->key != 0) {
        /* continue with a partial escape sequence */
        goto escape;
    } else if(args->converter->toULength == 1 && mySource < mySourceLimit && myTarget < args->targetLimit) {
        /* continue with a partial double-byte character */
        mySourceChar = args->converter->toUBytes[0];
        args->converter->toULength = 0;
        targetUniChar = missingCharMarker;
        goto getTrailByte;
    }

    while(mySource < mySourceLimit){

        targetUniChar =missingCharMarker;

        if(myTarget < args->targetLimit){

            mySourceChar= (unsigned char) *mySource++;

            switch(mySourceChar){
            case UCNV_SI:
                pToU2022State->g=0;
                if (myData->isEmptySegment) {
                    myData->isEmptySegment = FALSE;	/* we are handling it, reset to avoid future spurious errors */
                    *err = U_ILLEGAL_ESCAPE_SEQUENCE;
                    args->converter->toUCallbackReason = UCNV_IRREGULAR;
                    args->converter->toUBytes[0] = static_cast<uint8_t>(mySourceChar);
                    args->converter->toULength = 1;
                    args->target = myTarget;
                    args->source = mySource;
                    return;
                }
                continue;

            case UCNV_SO:
                if(pToU2022State->cs[1] != 0) {
                    pToU2022State->g=1;
                    myData->isEmptySegment = TRUE;	/* Begin a new segment, empty so far */
                    continue;
                } else {
                    /* illegal to have SO before a matching designator */
                    myData->isEmptySegment = FALSE;	/* Handling a different error, reset this to avoid future spurious errs */
                    break;
                }

            case ESC_2022:
                mySource--;
escape:
                {
                    const char * mySourceBefore = mySource;
                    int8_t toULengthBefore = args->converter->toULength;

                    changeState_2022(args->converter,&(mySource),
                        mySourceLimit, ISO_2022_CN,err);

                    /* After SO there must be at least one character before a designator (designator error handled separately) */
                    if(myData->key==0 && U_SUCCESS(*err) && myData->isEmptySegment) {
                        *err = U_ILLEGAL_ESCAPE_SEQUENCE;
                        args->converter->toUCallbackReason = UCNV_IRREGULAR;
                        args->converter->toULength = (int8_t)(toULengthBefore + (mySource - mySourceBefore));
                    }
                }

                /* invalid or illegal escape sequence */
                if(U_FAILURE(*err)){
                    args->target = myTarget;
                    args->source = mySource;
                    myData->isEmptySegment = FALSE;	/* Reset to avoid future spurious errors */
                    return;
                }
                continue;

            /* ISO-2022-CN does not use single-byte (C1) SS2 and SS3 */

            case CR:
            case LF:
                uprv_memset(pToU2022State, 0, sizeof(ISO2022State));
                U_FALLTHROUGH;
            default:
                /* convert one or two bytes */
                myData->isEmptySegment = FALSE;
                if(pToU2022State->g != 0) {
                    if(mySource < mySourceLimit) {
                        UConverterSharedData *cnv;
                        StateEnum tempState;
                        int32_t tempBufLen;
                        int leadIsOk, trailIsOk;
                        uint8_t trailByte;
getTrailByte:
                        trailByte = (uint8_t)*mySource;
                        /*
                         * Ticket 5691: consistent illegal sequences:
                         * - We include at least the first byte in the illegal sequence.
                         * - If any of the non-initial bytes could be the start of a character,
                         *   we stop the illegal sequence before the first one of those.
                         *
                         * In ISO-2022 DBCS, if the second byte is in the 21..7e range or is
                         * an ESC/SO/SI, we report only the first byte as the illegal sequence.
                         * Otherwise we convert or report the pair of bytes.
                         */
                        leadIsOk = (uint8_t)(mySourceChar - 0x21) <= (0x7e - 0x21);
                        trailIsOk = (uint8_t)(trailByte - 0x21) <= (0x7e - 0x21);
                        if (leadIsOk && trailIsOk) {
                            ++mySource;
                            tempState = (StateEnum)pToU2022State->cs[pToU2022State->g];
                            if(tempState >= CNS_11643_0) {
                                cnv = myData->myConverterArray[CNS_11643];
                                tempBuf[0] = (char) (0x80+(tempState-CNS_11643_0));
                                tempBuf[1] = (char) (mySourceChar);
                                tempBuf[2] = (char) trailByte;
                                tempBufLen = 3;

                            }else{
                                U_ASSERT(tempState<UCNV_2022_MAX_CONVERTERS);
                                cnv = myData->myConverterArray[tempState];
                                tempBuf[0] = (char) (mySourceChar);
                                tempBuf[1] = (char) trailByte;
                                tempBufLen = 2;
                            }
                            targetUniChar = ucnv_MBCSSimpleGetNextUChar(cnv, tempBuf, tempBufLen, FALSE);
                            mySourceChar = (mySourceChar << 8) | trailByte;
                        } else if (!(trailIsOk || IS_2022_CONTROL(trailByte))) {
                            /* report a pair of illegal bytes if the second byte is not a DBCS starter */
                            ++mySource;
                            /* add another bit so that the code below writes 2 bytes in case of error */
                            mySourceChar = 0x10000 | (mySourceChar << 8) | trailByte;
                        }
                        if(pToU2022State->g>=2) {
                            /* return from a single-shift state to the previous one */
                            pToU2022State->g=pToU2022State->prevG;
                        }
                    } else {
                        args->converter->toUBytes[0] = (uint8_t)mySourceChar;
                        args->converter->toULength = 1;
                        goto endloop;
                    }
                }
                else{
                    if(mySourceChar <= 0x7f) {
                        targetUniChar = (UChar) mySourceChar;
                    }
                }
                break;
            }
            if(targetUniChar < (missingCharMarker-1/*0xfffe*/)){
                if(args->offsets){
                    args->offsets[myTarget - args->target] = (int32_t)(mySource - args->source - (mySourceChar <= 0xff ? 1 : 2));
                }
                *(myTarget++)=(UChar)targetUniChar;
            }
            else if(targetUniChar > missingCharMarker){
                /* disassemble the surrogate pair and write to output*/
                targetUniChar-=0x0010000;
                *myTarget = (UChar)(0xd800+(UChar)(targetUniChar>>10));
                if(args->offsets){
                    args->offsets[myTarget - args->target] = (int32_t)(mySource - args->source - (mySourceChar <= 0xff ? 1 : 2));
                }
                ++myTarget;
                if(myTarget< args->targetLimit){
                    *myTarget = (UChar)(0xdc00+(UChar)(targetUniChar&0x3ff));
                    if(args->offsets){
                        args->offsets[myTarget - args->target] = (int32_t)(mySource - args->source - (mySourceChar <= 0xff ? 1 : 2));
                    }
                    ++myTarget;
                }else{
                    args->converter->UCharErrorBuffer[args->converter->UCharErrorBufferLength++]=
                                    (UChar)(0xdc00+(UChar)(targetUniChar&0x3ff));
                }

            }
            else{
                /* Call the callback function*/
                toUnicodeCallback(args->converter,mySourceChar,targetUniChar,err);
                break;
            }
        }
        else{
            *err =U_BUFFER_OVERFLOW_ERROR;
            break;
        }
    }
endloop:
    args->target = myTarget;
    args->source = mySource;
}